

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

bool __thiscall amrex::StreamRetry::TryOutput(StreamRetry *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  streamoff sVar4;
  Print *this_00;
  int *in_RDI;
  int myProc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff738;
  Print *in_stack_fffffffffffff740;
  undefined7 in_stack_fffffffffffff748;
  undefined1 in_stack_fffffffffffff74f;
  Print *in_stack_fffffffffffff750;
  bool local_1;
  
  if (*in_RDI == 0) {
    *in_RDI = *in_RDI + 1;
    local_1 = true;
  }
  else {
    uVar3 = std::ios::fail();
    if ((uVar3 & 1) == 0) {
      local_1 = false;
    }
    else {
      nStreamErrors = nStreamErrors + 1;
      ParallelDescriptor::MyProc();
      if (in_RDI[1] < *in_RDI) {
        iVar2 = Verbose();
        if (1 < iVar2) {
          OutStream();
          AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffff740,
                             (ostream *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [7])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(int *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [18])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [4])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(int *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [37])in_stack_fffffffffffff738);
          std::ios::good();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::bad();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::fail();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::eof();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [11])in_stack_fffffffffffff738);
          ParallelDescriptor::second();
          Print::operator<<(in_stack_fffffffffffff740,(double *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [18])in_stack_fffffffffffff738);
          std::ostream::tellp();
          Print::operator<<(in_stack_fffffffffffff750,
                            (fpos<__mbstate_t> *)
                            CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [19])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff750,
                            (fpos<__mbstate_t> *)
                            CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
          Print::operator<<(in_stack_fffffffffffff740,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)in_stack_fffffffffffff738);
          AllPrint::~AllPrint((AllPrint *)0x11e923c);
        }
        std::ios::clear((int)*(long **)(in_RDI + 0xc) +
                        (int)*(undefined8 *)(**(long **)(in_RDI + 0xc) + -0x18));
        iVar2 = Verbose();
        if (1 < iVar2) {
          OutStream();
          AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffff740,
                             (ostream *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [27])in_stack_fffffffffffff738);
          std::ios::good();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::bad();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::fail();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::eof();
          this_00 = Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          Print::operator<<(this_00,(_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                                     *)in_stack_fffffffffffff738);
          AllPrint::~AllPrint((AllPrint *)0x11e93fa);
        }
        local_1 = false;
      }
      else {
        iVar2 = Verbose();
        if (1 < iVar2) {
          OutStream();
          AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffff740,
                             (ostream *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [7])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(int *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [17])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [4])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(int *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [12])in_stack_fffffffffffff738);
          std::ios::good();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::bad();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::fail();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::eof();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [11])in_stack_fffffffffffff738);
          ParallelDescriptor::second();
          Print::operator<<(in_stack_fffffffffffff740,(double *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [18])in_stack_fffffffffffff738);
          std::ostream::tellp();
          Print::operator<<(in_stack_fffffffffffff750,
                            (fpos<__mbstate_t> *)
                            CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [19])in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff750,
                            (fpos<__mbstate_t> *)
                            CONCAT17(in_stack_fffffffffffff74f,in_stack_fffffffffffff748));
          Print::operator<<(in_stack_fffffffffffff740,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)in_stack_fffffffffffff738);
          AllPrint::~AllPrint((AllPrint *)0x11e8c6e);
        }
        std::ios::clear((int)*(long **)(in_RDI + 0xc) +
                        (int)*(undefined8 *)(**(long **)(in_RDI + 0xc) + -0x18));
        iVar2 = Verbose();
        if (1 < iVar2) {
          OutStream();
          AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffff740,
                             (ostream *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,(char (*) [27])in_stack_fffffffffffff738);
          std::ios::good();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::bad();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::fail();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          std::ios::eof();
          Print::operator<<(in_stack_fffffffffffff740,(bool *)in_stack_fffffffffffff738);
          Print::operator<<(in_stack_fffffffffffff740,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)in_stack_fffffffffffff738);
          AllPrint::~AllPrint((AllPrint *)0x11e8e68);
        }
        lVar1 = *(long *)(in_RDI + 0xc);
        sVar4 = std::fpos::operator_cast_to_long((fpos *)(in_RDI + 0xe));
        std::ostream::seekp(lVar1,(_Ios_Seekdir)sVar4);
        *in_RDI = *in_RDI + 1;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool amrex::StreamRetry::TryOutput()
{
  if(tries == 0) {
    ++tries;
    return true;
  } else {
    if(sros.fail()) {
      ++nStreamErrors;
      int myProc(ParallelDescriptor::MyProc());
      if(tries <= maxTries) {
          if (amrex::Verbose() > 1) {
              amrex::AllPrint() << "PROC: " << myProc << " :: STREAMRETRY_" << suffix << " # "
                                << tries << " :: gbfe:  "
                                << sros.good() << sros.bad() << sros.fail() << sros.eof()
                                << " :: sec = " << ParallelDescriptor::second()
                                << " :: os.tellp() = " << sros.tellp()
                                << " :: rewind spos = " << spos
                                << std::endl;
          }
        sros.clear();  // clear the bad bits
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "After os.clear() : gbfe:  " << sros.good() << sros.bad()
                              << sros.fail() << sros.eof() << std::endl;
        }
        sros.seekp(spos, std::ios::beg);  // reset stream position
        ++tries;
        return true;
      } else {
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "PROC: " << myProc << " :: STREAMFAILED_" << suffix << " # "
                              << tries << " :: File may be corrupt.  :: gbfe:  "
                              << sros.good() << sros.bad() << sros.fail() << sros.eof()
                              << " :: sec = " << ParallelDescriptor::second()
                              << " :: os.tellp() = " << sros.tellp()
                              << " :: rewind spos = " << spos
                              << std::endl;
        }
        sros.clear();  // clear the bad bits
        if (amrex::Verbose() > 1) {
            amrex::AllPrint() << "After os.clear() : gbfe:  " << sros.good() << sros.bad()
                              << sros.fail() << sros.eof() << std::endl;
        }
        return false;
      }
    } else {
      return false;
    }
  }
}